

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  urlpieces *part;
  undefined1 *puVar1;
  char **passwordp;
  char **ppcVar2;
  alpnid aVar3;
  curl_slist *pcVar4;
  altsvcinfo *asi;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  void *pvVar8;
  curl_proxytype proxytype;
  undefined4 uVar9;
  uchar uVar10;
  _Bool _Var11;
  byte bVar12;
  ushort uVar13;
  CURLUcode CVar14;
  int iVar15;
  CURLcode CVar16;
  CURLcode CVar17;
  resolve_t rVar18;
  connectdata *conn;
  ulong uVar19;
  char *pcVar20;
  CURLU *u;
  size_t sVar21;
  size_t sVar22;
  stsentry *psVar23;
  Curl_handler *pCVar24;
  ulong uVar25;
  char *pcVar26;
  timediff_t tVar27;
  Curl_dns_entry *pCVar28;
  Curl_addrinfo *pCVar29;
  curl_trc_feat *pcVar30;
  byte bVar31;
  ConnectBits CVar32;
  byte bVar33;
  ulong uVar34;
  char *pcVar35;
  long lVar36;
  uint uVar37;
  char **ppcVar38;
  byte *pbVar39;
  char **ppcVar40;
  connectdata *conn_00;
  char *pcVar41;
  hostname *host;
  byte *__s;
  bool bVar42;
  curltime cVar43;
  curltime newer;
  curltime older;
  curl_slist **local_a8;
  char *local_a0;
  proxy_info *local_98;
  alpnid local_90;
  char *newurl;
  Curl_easy *pCStack_80;
  connectdata *local_78;
  ulong uStack_70;
  byte *local_60;
  hostname *local_58;
  _Bool *local_50;
  hostname *local_48;
  _Bool *local_40;
  char *local_38;
  
  *asyncp = false;
  Curl_req_hard_reset(&data->req,data);
  *asyncp = false;
  if ((data->state).url == (char *)0x0) {
    return CURLE_URL_MALFORMAT;
  }
  conn = (connectdata *)(*Curl_ccalloc)(1,0x588);
  if (conn == (connectdata *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  conn->sock[0] = -1;
  conn->sock[1] = -1;
  conn->sockfd = -1;
  conn->writesockfd = -1;
  conn->connection_id = -1;
  (conn->primary).remote_port = -1;
  conn->remote_port = -1;
  CVar16 = CURLE_UNSUPPORTED_PROTOCOL;
  Curl_conncontrol(conn,1);
  cVar43 = Curl_now();
  (conn->created).tv_sec = cVar43.tv_sec;
  (conn->created).tv_usec = cVar43.tv_usec;
  (conn->keepalive).tv_sec = (conn->created).tv_sec;
  (conn->keepalive).tv_usec = (conn->created).tv_usec;
  *(undefined4 *)&(conn->keepalive).field_0xc = *(undefined4 *)&(conn->created).field_0xc;
  bVar12 = (data->set).proxytype;
  (conn->http_proxy).proxytype = bVar12;
  (conn->socks_proxy).proxytype = '\x04';
  pcVar20 = (data->set).str[0x26];
  if ((pcVar20 == (char *)0x0) || (*pcVar20 == '\0')) {
    uVar19 = 0;
    uVar25 = 0;
    uVar34 = 0;
  }
  else {
    uVar25 = 0x10;
    uVar19 = (ulong)(bVar12 < 4);
    uVar34 = (ulong)((uint)(bVar12 >= 4) * 2);
  }
  CVar32 = (ConnectBits)((ulong)conn->bits & 0xffffffffffffffec | uVar19 | uVar25 | uVar34);
  conn->bits = CVar32;
  pcVar20 = (data->set).str[0x27];
  if ((pcVar20 != (char *)0x0) && (*pcVar20 != '\0')) {
    CVar32 = (ConnectBits)((ulong)CVar32 | 0x12);
    conn->bits = CVar32;
  }
  CVar32 = (ConnectBits)
           (((ulong)CVar32 & 0xfffffffffffffffb) +
           (ulong)((data->state).aptr.proxyuser != (char *)0x0) * 4);
  conn->bits = CVar32;
  uVar25 = (ulong)(*(uint *)&(data->set).field_0x8ca >> 5 & 8);
  conn->bits = (ConnectBits)((ulong)CVar32 & 0xfffffffffffffff7 | uVar25);
  CVar32 = (ConnectBits)
           (((ulong)CVar32 & 0xffffffffffff7ff7 | uVar25) +
           (ulong)(*(uint *)&(data->set).field_0x8ca & 0x2000) * 4);
  conn->bits = CVar32;
  conn->bits = (ConnectBits)
               (((ulong)CVar32 & 0xfffffffffffeffff) +
               (ulong)(*(uint *)&(data->set).field_0x8ca & 0x4000) * 4);
  conn->ip_version = (data->set).ipver;
  conn->connect_only = (data->set).connect_only;
  conn->transport = '\x03';
  Curl_llist_init(&conn->easyq,(Curl_llist_dtor)0x0);
  pcVar20 = (data->set).str[0x1e];
  if (pcVar20 != (char *)0x0) {
    pcVar20 = (*Curl_cstrdup)(pcVar20);
    conn->localdev = pcVar20;
    if (pcVar20 == (char *)0x0) {
      (*Curl_cfree)((void *)0x0);
      (*Curl_cfree)(conn);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  conn->localportrange = (data->set).localportrange;
  conn->localport = (data->set).localport;
  pvVar8 = (data->set).closesocket_client;
  conn->fclosesocket = (data->set).fclosesocket;
  conn->closesocket_client = pvVar8;
  iVar15 = (conn->created).tv_usec;
  uVar9 = *(undefined4 *)&(conn->created).field_0xc;
  (conn->lastused).tv_sec = (conn->created).tv_sec;
  (conn->lastused).tv_usec = iVar15;
  *(undefined4 *)&(conn->lastused).field_0xc = uVar9;
  conn->gssapi_delegation = (data->set).gssapi_delegation;
  if ((data->set).uh == (CURLU *)0x0) {
    bVar42 = false;
  }
  else {
    bVar42 = ((data->state).field_0x774 & 2) == 0;
  }
  local_50 = asyncp;
  local_40 = protocol_done;
  up_free(data);
  if (bVar42) {
    u = curl_url_dup((data->set).uh);
  }
  else {
    u = curl_url();
  }
  (data->state).uh = u;
  local_98._0_4_ = CURLE_OUT_OF_MEMORY;
  if (u == (CURLU *)0x0) goto switchD_0015a04c_caseD_5;
  if (((data->set).str[0x1d] != (char *)0x0) &&
     (sVar21 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar21 == 0)) {
    pcVar20 = curl_maprintf("%s://%s",(data->set).str[0x1d],(data->state).url);
    if (pcVar20 != (char *)0x0) {
      uVar37 = *(uint *)&(data->state).field_0x774;
      if ((uVar37 >> 0xe & 1) != 0) {
        (*Curl_cfree)((data->state).url);
        uVar37 = *(uint *)&(data->state).field_0x774;
      }
      (data->state).url = pcVar20;
      *(uint *)&(data->state).field_0x774 = uVar37 | 0x4000;
      goto LAB_0015a00d;
    }
    goto switchD_0015a04c_caseD_7;
  }
LAB_0015a00d:
  if (!bVar42) {
    uVar37 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x8ca >> 0x20);
    CVar14 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                          (uVar37 >> 10 & 0x20) + (uVar37 >> 5 & 0x10) + 0x208);
    if (CVar14 == CURLUE_OK) {
      CVar14 = curl_url_get(u,CURLUPART_URL,&newurl,0);
      local_98._0_4_ = CURLE_URL_MALFORMAT;
      switch(CVar14) {
      case CURLUE_OK:
        uVar37 = *(uint *)&(data->state).field_0x774;
        if ((uVar37 >> 0xe & 1) != 0) {
          (*Curl_cfree)((data->state).url);
          uVar37 = *(uint *)&(data->state).field_0x774;
        }
        (data->state).url = newurl;
        *(uint *)&(data->state).field_0x774 = uVar37 | 0x4000;
        goto LAB_0015a016;
      default:
        goto switchD_0015a04c_caseD_5;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0015a145_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0015a04c_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0015a04c_caseD_8;
      }
    }
    pcVar20 = curl_url_strerror(CVar14);
    Curl_failf(data,"URL rejected: %s",pcVar20);
    if (CVar14 - CURLUE_UNSUPPORTED_SCHEME < 4) {
      local_98._0_4_ =
           *(CURLcode *)(&DAT_00177b88 + (ulong)(CVar14 - CURLUE_UNSUPPORTED_SCHEME) * 4);
      goto switchD_0015a04c_caseD_5;
    }
    goto switchD_0015a44f_caseD_6;
  }
LAB_0015a016:
  part = &(data->state).up;
  local_98._0_4_ = CURLE_UNSUPPORTED_PROTOCOL;
  CVar14 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
  switch(CVar14) {
  case CURLUE_OK:
    ppcVar38 = &(data->state).up.hostname;
    CVar14 = curl_url_get(u,CURLUPART_HOST,ppcVar38,0);
    if (CVar14 == CURLUE_OK) {
      pcVar20 = *ppcVar38;
      sVar22 = strlen(pcVar20);
      if (0xffff < sVar22) {
        Curl_failf(data,"Too long hostname (maximum is %d)",0xffff);
        goto switchD_0015a04c_caseD_1;
      }
    }
    else {
      iVar15 = curl_strequal("file",part->scheme);
      if (iVar15 == 0) goto switchD_0015a04c_caseD_7;
      pcVar20 = *ppcVar38;
    }
    if (pcVar20 == (char *)0x0) {
      pcVar41 = (char *)0x0;
    }
    else {
      pcVar41 = pcVar20;
      if (*pcVar20 == '[') {
        puVar1 = &(conn->bits).field_0x1;
        *puVar1 = *puVar1 | 4;
        pcVar41 = pcVar20 + 1;
        sVar22 = strlen(pcVar41);
        pcVar20[sVar22] = '\0';
        zonefrom_url(u,data,conn);
      }
    }
    if (pcVar41 == (char *)0x0) {
      pcVar41 = "";
    }
    pcVar20 = (*Curl_cstrdup)(pcVar41);
    (conn->host).rawalloc = pcVar20;
    if (pcVar20 == (char *)0x0) goto switchD_0015a04c_caseD_7;
    host = &conn->host;
    (conn->host).name = pcVar20;
    CVar16 = Curl_idnconvert_hostname(host);
    if (CVar16 != CURLE_OK) goto LAB_0015a22d;
    if (((data->hsts != (hsts *)0x0) && (iVar15 = curl_strequal("http",part->scheme), iVar15 != 0))
       && (psVar23 = Curl_hsts(data->hsts,(conn->host).name,true), psVar23 != (stsentry *)0x0)) {
      local_58 = host;
      (*Curl_cfree)(part->scheme);
      part->scheme = (char *)0x0;
      CVar14 = curl_url_set(u,CURLUPART_SCHEME,"https",0);
      CVar16 = CURLE_URL_MALFORMAT;
      switch(CVar14) {
      case CURLUE_OK:
        if (((data->state).field_0x775 & 0x40) != 0) {
          (*Curl_cfree)((data->state).url);
          (data->state).url = (char *)0x0;
        }
        CVar14 = curl_url_get(u,CURLUPART_URL,&newurl,0);
        switch(CVar14) {
        case CURLUE_OK:
          CVar14 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
          if (CVar14 == CURLUE_OK) {
            (data->state).url = newurl;
            puVar1 = &(data->state).field_0x775;
            *puVar1 = *puVar1 | 0x40;
            host = local_58;
            if ((((data->set).field_0x8cd & 0x10) != 0) &&
               ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 ||
                (0 < pcVar30->log_level)))) {
              Curl_infof(data,"Switched from HTTP to HTTPS due to HSTS => %s");
              host = local_58;
            }
            goto LAB_0015a3b2;
          }
          (*Curl_cfree)(newurl);
          if (CVar14 - CURLUE_UNSUPPORTED_SCHEME < 4) {
            CVar16 = *(CURLcode *)(&DAT_00177b88 + (ulong)(CVar14 - CURLUE_UNSUPPORTED_SCHEME) * 4);
          }
          break;
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_0015a2d0_caseD_5;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_0015a2d0_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_0015a2d0_caseD_8;
        }
        break;
      case CURLUE_UNSUPPORTED_SCHEME:
switchD_0015a2d0_caseD_5:
        CVar16 = CURLE_UNSUPPORTED_PROTOCOL;
        break;
      case CURLUE_OUT_OF_MEMORY:
switchD_0015a2d0_caseD_7:
        CVar16 = CURLE_OUT_OF_MEMORY;
        break;
      case CURLUE_USER_NOT_ALLOWED:
switchD_0015a2d0_caseD_8:
        CVar16 = CURLE_LOGIN_DENIED;
      }
switchD_0015a145_caseD_5:
      local_98._0_4_ = CVar16;
      break;
    }
LAB_0015a3b2:
    pcVar20 = part->scheme;
    pCVar24 = Curl_get_scheme_handler(pcVar20);
    if (pCVar24 == (Curl_handler *)0x0) {
      pcVar41 = "not supported";
LAB_0015a458:
      pcVar35 = " (in redirect)";
      if (((data->state).field_0x774 & 2) == 0) {
        pcVar35 = "";
      }
      Curl_failf(data,"Protocol \"%s\" %s%s",pcVar20,pcVar41,pcVar35);
      break;
    }
    pcVar41 = "disabled";
    if ((((data->set).allowed_protocols & pCVar24->protocol) == 0) ||
       ((((data->state).field_0x774 & 2) != 0 &&
        (((data->set).redir_protocols & pCVar24->protocol) == 0)))) goto LAB_0015a458;
    conn->given = pCVar24;
    conn->handler = pCVar24;
    local_58 = host;
    if ((data->set).str[0x2e] == (char *)0x0) {
      ppcVar38 = &(data->state).up.password;
      CVar14 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar38,0);
      switch(CVar14) {
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0015a04c_caseD_5;
      case CURLUE_URLDECODE:
      case CURLUE_UNKNOWN_PART:
      case CURLUE_NO_SCHEME:
      case CURLUE_NO_USER:
        goto switchD_0015a44f_caseD_6;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0015a04c_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0015a04c_caseD_8;
      case CURLUE_NO_PASSWORD:
        goto switchD_0015a4bd_caseD_c;
      default:
        if (CVar14 != CURLUE_OK) goto switchD_0015a44f_caseD_6;
        CVar16 = Curl_urldecode(*ppcVar38,0,&newurl,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        if (CVar16 == CURLE_OK) {
          conn->passwd = newurl;
          CVar16 = Curl_setstropt(&(data->state).aptr.passwd,newurl);
          if (CVar16 == CURLE_OK) goto switchD_0015a4bd_caseD_c;
        }
      }
      goto LAB_0015a22d;
    }
switchD_0015a4bd_caseD_c:
    if ((data->set).str[0x2d] == (char *)0x0) {
      ppcVar38 = &(data->state).up.user;
      CVar14 = curl_url_get(u,CURLUPART_USER,ppcVar38,0);
      switch(CVar14) {
      case CURLUE_OK:
        CVar16 = Curl_urldecode(*ppcVar38,0,&newurl,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        if (CVar16 != CURLE_OK) goto LAB_0015a22d;
        conn->user = newurl;
        pcVar20 = newurl;
        break;
      default:
        goto switchD_0015a44f_caseD_6;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0015a04c_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0015a04c_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0015a04c_caseD_8;
      case CURLUE_NO_USER:
        if ((data->state).aptr.passwd == (char *)0x0) goto LAB_0015a41d;
        pcVar20 = "";
      }
      CVar16 = Curl_setstropt(&(data->state).aptr.user,pcVar20);
      if (CVar16 != CURLE_OK) goto LAB_0015a22d;
    }
LAB_0015a41d:
    ppcVar38 = &(data->state).up.options;
    CVar14 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar38,0x40);
    switch(CVar14) {
    case CURLUE_UNSUPPORTED_SCHEME:
      break;
    case CURLUE_URLDECODE:
    case CURLUE_UNKNOWN_PART:
    case CURLUE_NO_SCHEME:
    case CURLUE_NO_USER:
    case CURLUE_NO_PASSWORD:
      goto switchD_0015a44f_caseD_6;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0015a04c_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0015a04c_caseD_8;
    case CURLUE_NO_OPTIONS:
switchD_0015a44f_caseD_d:
      CVar14 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
      switch(CVar14) {
      case CURLUE_OK:
        goto switchD_0015a587_caseD_0;
      default:
        goto switchD_0015a44f_caseD_6;
      case CURLUE_UNSUPPORTED_SCHEME:
        break;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0015a04c_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0015a04c_caseD_8;
      }
    default:
      if (CVar14 == CURLUE_OK) {
        pcVar20 = (*Curl_cstrdup)(*ppcVar38);
        conn->options = pcVar20;
        if (pcVar20 != (char *)0x0) goto switchD_0015a44f_caseD_d;
        goto switchD_0015a04c_caseD_7;
      }
switchD_0015a44f_caseD_6:
      local_98._0_4_ = CURLE_URL_MALFORMAT;
    }
    break;
  default:
switchD_0015a04c_caseD_1:
    local_98._0_4_ = CURLE_URL_MALFORMAT;
  case CURLUE_UNSUPPORTED_SCHEME:
    break;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_0015a04c_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_0015a04c_caseD_8:
    local_98._0_4_ = CURLE_LOGIN_DENIED;
  }
switchD_0015a04c_caseD_5:
  if (((CURLcode)local_98 != CURLE_OK) && (conn != (connectdata *)0x0)) {
    Curl_detach_connection(data);
    Curl_cpool_disconnect(data,conn,true);
  }
  return (CURLcode)local_98;
switchD_0015a587_caseD_0:
  CVar14 = curl_url_get(u,CURLUPART_PORT,&(data->state).up.port,1);
  if (CVar14 == CURLUE_OK) {
    uVar25 = strtoul((data->state).up.port,(char **)0x0,10);
    uVar13 = (data->set).use_port;
    if ((uVar13 == 0) || (((data->state).field_0x774 & 0x10) == 0)) {
      uVar13 = curlx_ultous(uVar25);
    }
    conn->remote_port = (uint)uVar13;
    (conn->primary).remote_port = (uint)uVar13;
  }
  else {
    iVar15 = curl_strequal("file",part->scheme);
    if (iVar15 == 0) goto switchD_0015a04c_caseD_7;
  }
  local_90 = ALPN_h1;
  curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
  uVar37 = (data->set).scope_id;
  if (uVar37 != 0) {
    conn->scope_id = uVar37;
  }
  pcVar20 = (data->set).str[0x42];
  if (pcVar20 != (char *)0x0) {
    pcVar20 = (*Curl_cstrdup)(pcVar20);
    conn->sasl_authzid = pcVar20;
    if (pcVar20 == (char *)0x0) goto switchD_0015a04c_caseD_7;
  }
  pcVar20 = (data->set).str[0x3c];
  if (pcVar20 != (char *)0x0) {
    pcVar20 = (*Curl_cstrdup)(pcVar20);
    conn->oauth_bearer = pcVar20;
    if (pcVar20 == (char *)0x0) goto switchD_0015a04c_caseD_7;
  }
  pcVar20 = (data->set).str[0x3d];
  if (pcVar20 == (char *)0x0) {
    CVar32 = conn->bits;
  }
  else {
    pcVar20 = (*Curl_cstrdup)(pcVar20);
    conn->unix_domain_socket = pcVar20;
    if (pcVar20 == (char *)0x0) goto switchD_0015a04c_caseD_7;
    CVar32 = (ConnectBits)
             ((ulong)conn->bits & 0xfffffffffbffffff |
             (ulong)((uint)(*(ulong *)&(data->set).field_0x8ca >> 0x14) & 0x4000000));
    conn->bits = CVar32;
  }
  if (((ulong)CVar32 & 4) == 0) {
LAB_0015a7c2:
    pcVar20 = (data->set).str[0x26];
    if (pcVar20 == (char *)0x0) {
      local_a8 = (curl_slist **)0x0;
    }
    else {
      local_a8 = (curl_slist **)(*Curl_cstrdup)(pcVar20);
      if (local_a8 == (curl_slist **)0x0) {
        Curl_failf(data,"memory shortage");
        CVar16 = CURLE_OUT_OF_MEMORY;
        goto LAB_0015ab1c;
      }
    }
    pcVar20 = (data->set).str[0x27];
    if (pcVar20 == (char *)0x0) {
      pcVar20 = (char *)0x0;
LAB_0015a847:
      if ((data->set).str[0x32] == (char *)0x0) {
        pcVar41 = "no_proxy";
        local_a0 = curl_getenv("no_proxy");
        if (local_a0 == (char *)0x0) {
          pcVar41 = "NO_PROXY";
          local_a0 = curl_getenv("NO_PROXY");
          if (local_a0 == (char *)0x0) goto LAB_0015a855;
        }
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 ||
            (0 < pcVar30->log_level)))) {
          Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar41,local_a0);
        }
      }
      else {
LAB_0015a855:
        local_a0 = (char *)0x0;
      }
      pcVar41 = (data->set).str[0x32];
      if (pcVar41 == (char *)0x0) {
        pcVar41 = local_a0;
      }
      _Var11 = Curl_check_noproxy((conn->host).name,pcVar41);
      if (_Var11) {
        (*Curl_cfree)(local_a8);
        (*Curl_cfree)(pcVar20);
LAB_0015a891:
        local_a8 = (curl_slist **)0x0;
LAB_0015a899:
        pcVar20 = (char *)0x0;
      }
      else if (local_a8 == (curl_slist **)0x0 && pcVar20 == (char *)0x0) {
        curl_msnprintf((char *)&newurl,0x14,"%s_proxy",conn->handler->scheme);
        local_a8 = (curl_slist **)curl_getenv((char *)&newurl);
        ppcVar38 = &newurl;
        if (local_a8 == (curl_slist **)0x0) {
          pcVar20 = "http_proxy";
          iVar15 = curl_strequal("http_proxy",(char *)&newurl);
          if (iVar15 == 0) {
            Curl_strntoupper((char *)&newurl,(char *)&newurl,0x14);
            local_a8 = (curl_slist **)curl_getenv((char *)&newurl);
            ppcVar38 = &newurl;
            if (local_a8 != (curl_slist **)0x0) goto LAB_0015aa7e;
          }
          iVar15 = curl_strequal("ws_proxy",(char *)&newurl);
          if (iVar15 == 0) {
            iVar15 = curl_strequal("wss_proxy",(char *)&newurl);
            if (iVar15 != 0) {
              local_a8 = (curl_slist **)curl_getenv("https_proxy");
              ppcVar38 = &newurl;
              if (local_a8 != (curl_slist **)0x0) goto LAB_0015aa7e;
              pcVar20 = "HTTPS_PROXY";
              goto LAB_0015abb7;
            }
          }
          else {
LAB_0015abb7:
            local_a8 = (curl_slist **)curl_getenv(pcVar20);
            ppcVar38 = &newurl;
            if (local_a8 != (curl_slist **)0x0) goto LAB_0015aa7e;
          }
          local_a8 = (curl_slist **)curl_getenv("all_proxy");
          ppcVar38 = (char **)"all_proxy";
          if (local_a8 == (curl_slist **)0x0) {
            local_a8 = (curl_slist **)curl_getenv("ALL_PROXY");
            ppcVar38 = (char **)"ALL_PROXY";
            if (local_a8 == (curl_slist **)0x0) goto LAB_0015a891;
          }
        }
LAB_0015aa7e:
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 ||
            (0 < pcVar30->log_level)))) {
          Curl_infof(data,"Uses proxy env variable %s == \'%s\'",ppcVar38,local_a8);
        }
        goto LAB_0015a899;
      }
      (*Curl_cfree)(local_a0);
      if (local_a8 == (curl_slist **)0x0) {
LAB_0015a8db:
        local_a8 = (curl_slist **)0x0;
      }
      else if (((conn->unix_domain_socket != (char *)0x0) || (*(char *)local_a8 == '\0')) ||
              ((conn->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(local_a8);
        goto LAB_0015a8db;
      }
      if (pcVar20 == (char *)0x0) {
LAB_0015a935:
        if (local_a8 != (curl_slist **)0x0) {
          proxytype = (curl_proxytype)(conn->http_proxy).proxytype;
          pcVar20 = (char *)0x0;
          local_60 = (byte *)0x0;
LAB_0015a964:
          CVar16 = parse_proxy(data,conn,(char *)local_a8,proxytype);
          (*Curl_cfree)(local_a8);
          if (CVar16 == CURLE_OK) {
            if ((char)local_60 != '\0') goto LAB_0015aaeb;
            goto LAB_0015ab24;
          }
          local_a8 = (curl_slist **)0x0;
          goto LAB_0015ad52;
        }
        uVar25 = (ulong)conn->bits & 0xfffffffffffffffc;
      }
      else {
        if ((*pcVar20 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
          (*Curl_cfree)(pcVar20);
          goto LAB_0015a935;
        }
        proxytype = (curl_proxytype)(conn->http_proxy).proxytype;
        local_60 = (byte *)0x1;
        if (local_a8 != (curl_slist **)0x0) goto LAB_0015a964;
LAB_0015aaeb:
        CVar16 = parse_proxy(data,conn,pcVar20,proxytype);
        (*Curl_cfree)(pcVar20);
        if (CVar16 != CURLE_OK) goto LAB_0015ab1c;
LAB_0015ab24:
        local_98 = &conn->http_proxy;
        if ((local_98->host).rawalloc == (char *)0x0) {
          CVar32 = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffff6);
          conn->bits = CVar32;
          if ((conn->socks_proxy).host.rawalloc == (char *)0x0) goto LAB_0015ad04;
          if ((conn->socks_proxy).user == (char *)0x0) {
            pcVar20 = (conn->socks_proxy).passwd;
            (conn->socks_proxy).user = (conn->http_proxy).user;
            (conn->http_proxy).user = (char *)0x0;
            (*Curl_cfree)(pcVar20);
            (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
            (conn->http_proxy).passwd = (char *)0x0;
            CVar32 = conn->bits;
          }
        }
        else {
          CVar32 = conn->bits;
          if ((conn->handler->protocol & 0xc0000003) == 0) {
            if (((conn->handler->flags & 0x800) == 0) || (((ulong)CVar32 & 8) != 0)) {
              CVar32 = (ConnectBits)((ulong)CVar32 | 8);
            }
            else {
              conn->handler = &Curl_handler_http;
            }
          }
          CVar32 = (ConnectBits)((ulong)CVar32 | 1);
          if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
LAB_0015ad04:
            uVar25 = (ulong)CVar32 & 0xfffffffffffffffd;
            goto LAB_0015ad08;
          }
        }
        uVar25 = (ulong)CVar32 | 2;
      }
LAB_0015ad08:
      uVar19 = 0x10;
      if ((uVar25 & 1) == 0) {
        uVar19 = (ulong)((int)uVar25 * 8 & 0x10);
      }
      conn->bits = (ConnectBits)(uVar25 & 0xffffffffffffffef | uVar19);
      if (uVar19 == 0) {
        conn->bits = (ConnectBits)(uVar25 & 0xffffffffffffffe0);
        (conn->http_proxy).proxytype = '\0';
      }
      local_a8 = (curl_slist **)0x0;
      pcVar20 = (char *)0x0;
      CVar16 = CURLE_OK;
    }
    else {
      pcVar20 = (*Curl_cstrdup)(pcVar20);
      if (pcVar20 != (char *)0x0) goto LAB_0015a847;
      pcVar20 = (char *)0x0;
      Curl_failf(data,"memory shortage");
      CVar16 = CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar20 = (data->state).aptr.proxyuser;
    pcVar41 = (data->state).aptr.proxypasswd;
    if (pcVar20 == (char *)0x0) {
      pcVar20 = "";
    }
    pcVar20 = (*Curl_cstrdup)(pcVar20);
    (conn->http_proxy).user = pcVar20;
    CVar16 = CURLE_OUT_OF_MEMORY;
    if (pcVar20 != (char *)0x0) {
      if (pcVar41 == (char *)0x0) {
        pcVar41 = "";
      }
      pcVar20 = (*Curl_cstrdup)(pcVar41);
      (conn->http_proxy).passwd = pcVar20;
      if (pcVar20 != (char *)0x0) goto LAB_0015a7c2;
      (*Curl_cfree)((conn->http_proxy).user);
      (conn->http_proxy).user = (char *)0x0;
    }
LAB_0015ab1c:
    local_a8 = (curl_slist **)0x0;
    pcVar20 = (char *)0x0;
  }
LAB_0015ad52:
  (*Curl_cfree)(pcVar20);
  (*Curl_cfree)(local_a8);
  if (CVar16 != CURLE_OK) goto LAB_0015a22d;
  if (((conn->given->flags & 1) != 0) && (((ulong)conn->bits & 1) != 0)) {
    conn->bits = (ConnectBits)((ulong)conn->bits | 8);
  }
  uVar13 = (data->set).use_port;
  if ((uVar13 != 0) && (((data->state).field_0x774 & 0x10) != 0)) {
    conn->remote_port = (uint)uVar13;
    curl_msnprintf((char *)&newurl,0x10,"%d");
    CVar14 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)&newurl,0);
    if (CVar14 != CURLUE_OK) goto switchD_0015a04c_caseD_7;
  }
  if ((data->set).str[0x2f] != (char *)0x0) {
    (*Curl_cfree)(conn->options);
    pcVar20 = (*Curl_cstrdup)((data->set).str[0x2f]);
    conn->options = pcVar20;
    if (pcVar20 == (char *)0x0) goto switchD_0015a04c_caseD_7;
  }
  ppcVar38 = &conn->user;
  passwordp = &conn->passwd;
  if ((data->set).use_netrc == '\x02') {
    (*Curl_cfree)(*ppcVar38);
    *ppcVar38 = (char *)0x0;
    (*Curl_cfree)(*passwordp);
    *passwordp = (char *)0x0;
  }
  puVar1 = &(conn->bits).field_0x2;
  *puVar1 = *puVar1 & 0xf7;
  ppcVar40 = ppcVar38;
  if (((data->set).use_netrc == '\0') || ((data->set).str[0x2d] != (char *)0x0)) {
    pcVar20 = *ppcVar38;
    if (pcVar20 != (char *)0x0) goto LAB_0015ae92;
  }
  else {
    ppcVar2 = &(data->state).aptr.user;
    pcVar20 = (data->state).aptr.user;
    ppcVar40 = ppcVar2;
    if (pcVar20 == (char *)0x0) {
      ppcVar40 = ppcVar38;
    }
    iVar15 = Curl_parsenetrc(&(data->state).netrc,(conn->host).name,ppcVar40,passwordp,
                             (data->set).str[0x25]);
    if (iVar15 < 1) {
      if (iVar15 < 0) {
        Curl_failf(data,".netrc parser error");
        local_98._0_4_ = CURLE_READ_ERROR;
        goto switchD_0015a04c_caseD_5;
      }
      puVar1 = &(conn->bits).field_0x2;
      *puVar1 = *puVar1 | 8;
    }
    else if ((((data->set).field_0x8cd & 0x10) != 0) &&
            ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 ||
             (0 < pcVar30->log_level)))) {
      pcVar41 = (data->set).str[0x25];
      pcVar35 = ".netrc";
      if (pcVar41 != (char *)0x0) {
        pcVar35 = pcVar41;
      }
      Curl_infof(data,"Couldn\'t find host %s in the %s file; using defaults",(conn->host).name,
                 pcVar35);
    }
    if (pcVar20 != (char *)0x0) {
      (*Curl_cfree)(*ppcVar38);
      *ppcVar38 = (char *)0x0;
      pcVar20 = (*Curl_cstrdup)(*ppcVar2);
      *ppcVar38 = pcVar20;
      if (pcVar20 == (char *)0x0) goto switchD_0015a04c_caseD_7;
    }
    pcVar20 = *ppcVar40;
    if (pcVar20 == (char *)0x0) {
      if (*passwordp == (char *)0x0) goto LAB_0015aeaf;
      pcVar20 = (*Curl_cstrdup)("");
      *ppcVar40 = pcVar20;
      if (pcVar20 == (char *)0x0) goto switchD_0015a04c_caseD_7;
    }
LAB_0015ae92:
    if (((data->state).aptr.user != pcVar20) &&
       (CVar16 = Curl_setstropt(&(data->state).aptr.user,pcVar20), CVar16 != CURLE_OK))
    goto LAB_0015a22d;
  }
LAB_0015aeaf:
  pcVar20 = (data->state).aptr.user;
  local_98._0_4_ = CURLE_UNSUPPORTED_PROTOCOL;
  if (pcVar20 != (char *)0x0) {
    CVar14 = curl_url_set((data->state).uh,CURLUPART_USER,pcVar20,0x80);
    switch(CVar14) {
    case CURLUE_OK:
      if (*ppcVar40 == (char *)0x0) {
        pcVar20 = (*Curl_cstrdup)((data->state).aptr.user);
        *ppcVar40 = pcVar20;
        if (pcVar20 == (char *)0x0) goto switchD_0015a04c_caseD_7;
      }
      break;
    default:
      goto switchD_0015a44f_caseD_6;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0015a04c_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0015a04c_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0015a04c_caseD_8;
    }
  }
  if ((*passwordp != (char *)0x0) &&
     (CVar16 = Curl_setstropt(&(data->state).aptr.passwd,*passwordp), CVar16 != CURLE_OK))
  goto LAB_0015a22d;
  pcVar20 = (data->state).aptr.passwd;
  if (pcVar20 != (char *)0x0) {
    CVar14 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,pcVar20,0x80);
    switch(CVar14) {
    case CURLUE_OK:
      if (*passwordp == (char *)0x0) {
        pcVar20 = (*Curl_cstrdup)((data->state).aptr.passwd);
        *passwordp = pcVar20;
        if (pcVar20 == (char *)0x0) goto switchD_0015a04c_caseD_7;
      }
      goto LAB_0015af8b;
    default:
      local_98._0_4_ = CURLE_URL_MALFORMAT;
      break;
    case CURLUE_UNSUPPORTED_SCHEME:
      break;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0015a04c_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0015a04c_caseD_8;
    }
    goto switchD_0015a04c_caseD_5;
  }
LAB_0015af8b:
  if (((conn->handler->flags & 0x20) == 0) || ((data->state).aptr.user != (char *)0x0)) {
    pcVar41 = "";
    pcVar20 = "";
  }
  else {
    pcVar41 = "ftp@example.com";
    pcVar20 = "anonymous";
  }
  if (*ppcVar38 == (char *)0x0) {
    pcVar20 = (*Curl_cstrdup)(pcVar20);
    *ppcVar38 = pcVar20;
    if (pcVar20 == (char *)0x0) goto switchD_0015a04c_caseD_7;
  }
  if (*passwordp == (char *)0x0) {
    pcVar20 = (*Curl_cstrdup)(pcVar41);
    *passwordp = pcVar20;
    if (pcVar20 == (char *)0x0) goto switchD_0015a04c_caseD_7;
  }
  local_a8 = &(data->set).connect_to;
  local_48 = &conn->conn_to_host;
  CVar17 = CURLE_OUT_OF_MEMORY;
  pcVar20 = (char *)0x0;
  uVar25 = 0xffffffff;
LAB_0015b019:
  local_98._0_4_ = CVar17;
  if ((((int)uVar25 == -1) && (pcVar20 == (char *)0x0)) &&
     (pcVar4 = *local_a8, pcVar4 != (curl_slist *)0x0)) {
    pcVar20 = pcVar4->data;
    if (*pcVar20 == ':') {
LAB_0015b0d7:
      if (pcVar20[1] != ':') {
        pcVar41 = strchr(pcVar20 + 1,0x3a);
        if (pcVar41 != (char *)0x0) {
          newurl = (char *)0x0;
          lVar36 = strtol(pcVar20 + 1,&newurl,10);
          if ((newurl == pcVar41) && (lVar36 == conn->remote_port)) {
            pcVar20 = pcVar41 + 1;
            goto LAB_0015b0e6;
          }
        }
        goto LAB_0015b1b8;
      }
      pcVar20 = pcVar20 + 2;
LAB_0015b0e6:
      if (*pcVar20 == '\0') goto LAB_0015b1b8;
      local_60 = (byte *)(*Curl_cstrdup)(pcVar20);
      if (local_60 != (byte *)0x0) {
        __s = local_60;
        local_98 = (proxy_info *)local_60;
        if (*local_60 == 0x5b) {
          pbVar39 = local_60 + 2;
          local_98 = (proxy_info *)(local_60 + 1);
          for (__s = (byte *)local_98; bVar12 = *__s, bVar12 != 0; __s = __s + 1) {
            if ((9 < (byte)(bVar12 - 0x30)) &&
               ((0x38 < bVar12 - 0x2e ||
                ((0x1f8000001f81001U >> ((ulong)(bVar12 - 0x2e) & 0x3f) & 1) == 0)))) {
              if (bVar12 != 0x25) goto LAB_0015b2bd;
              if (__s[1] - 0x32 == 0) {
                iVar15 = 0x35 - (uint)__s[2];
              }
              else {
                iVar15 = -(__s[1] - 0x32);
              }
              if (((iVar15 != 0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                 ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar30->log_level)))) {
                Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.");
              }
              goto LAB_0015b280;
            }
            pbVar39 = pbVar39 + 1;
          }
          goto LAB_0015b2ca;
        }
        goto LAB_0015b2f6;
      }
    }
    else {
      bVar42 = (*(uint *)&conn->bits >> 10 & 1) == 0;
      pcVar41 = "[";
      if (bVar42) {
        pcVar41 = "";
      }
      pcVar35 = "]";
      if (bVar42) {
        pcVar35 = "";
      }
      pcVar41 = curl_maprintf("%s%s%s",pcVar41,(conn->host).name,pcVar35);
      if (pcVar41 != (char *)0x0) {
        sVar22 = strlen(pcVar41);
        iVar15 = curl_strnequal(pcVar20,pcVar41,sVar22);
        local_60 = (byte *)CONCAT44(local_60._4_4_,iVar15);
        (*Curl_cfree)(pcVar41);
        if (((int)local_60 != 0) && (pcVar20[sVar22] == ':')) {
          pcVar20 = pcVar20 + sVar22;
          goto LAB_0015b0d7;
        }
LAB_0015b1b8:
        pcVar20 = (char *)0x0;
        uVar25 = 0xffffffff;
        goto LAB_0015b1c1;
      }
    }
    goto switchD_0015a04c_caseD_5;
  }
  if (((((int)uVar25 != -1) || (pcVar20 != (char *)0x0)) ||
      (asi = data->asi, asi == (altsvcinfo *)0x0)) || (conn->handler->protocol != 2))
  goto LAB_0015b7c5;
  newurl = (char *)0x0;
  uVar37 = (uint)asi->flags & 8;
  uVar10 = (data->state).httpwant;
  local_98._0_4_ = CURLE_OK;
  switch(uVar10) {
  case '\x01':
  case '\x05':
    goto switchD_0015b5db_caseD_1;
  case '\x02':
    goto switchD_0015b5db_caseD_2;
  case '\x03':
    local_90 = ALPN_h2;
switchD_0015b5db_caseD_2:
    pcVar20 = (conn->host).rawalloc;
    _Var11 = Curl_altsvc_lookup(asi,local_90,pcVar20,conn->remote_port,(altsvc **)&newurl,uVar37);
    if (_Var11) {
LAB_0015b6a7:
      pcVar41 = (*Curl_cstrdup)(*(char **)(newurl + 0x10));
      if (pcVar41 == (char *)0x0) {
        local_98._0_4_ = CURLE_OUT_OF_MEMORY;
        goto switchD_0015b5db_caseD_1;
      }
      (conn->conn_to_host).rawalloc = pcVar41;
      (conn->conn_to_host).name = pcVar41;
      CVar32 = conn->bits;
      conn->bits = (ConnectBits)((ulong)CVar32 | 0x100);
      conn->conn_to_port = (uint)*(ushort *)(newurl + 0x18);
      conn->bits = (ConnectBits)((ulong)CVar32 | 0x380);
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 || (0 < pcVar30->log_level)
          ))) {
        pcVar35 = Curl_alpnid2str(local_90);
        iVar15 = conn->remote_port;
        pcVar26 = Curl_alpnid2str(*(alpnid *)(newurl + 0x1c));
        Curl_infof(data,"Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",pcVar35,pcVar20,iVar15,
                   pcVar26,pcVar41,(ulong)*(ushort *)(newurl + 0x18));
      }
      aVar3 = *(alpnid *)(newurl + 0x1c);
      if (local_90 != aVar3) {
        if (aVar3 == ALPN_h1) {
          uVar10 = '\v';
        }
        else if (aVar3 == ALPN_h3) {
          conn->transport = '\x05';
          uVar10 = '\x1e';
        }
        else {
          if (aVar3 != ALPN_h2) goto LAB_0015b7c5;
          uVar10 = '\x14';
        }
        conn->httpversion = uVar10;
      }
    }
    goto LAB_0015b7c5;
  case '\x04':
switchD_0015b5db_caseD_4:
    pcVar20 = local_58->rawalloc;
    local_90 = ALPN_none;
    _Var11 = false;
    bVar42 = false;
    while ((_Var11 == false && (!bVar42))) {
      _Var11 = Curl_altsvc_lookup(data->asi,ALPN_h1,pcVar20,conn->remote_port,(altsvc **)&newurl,
                                  uVar37);
      local_90 = ALPN_h1;
      bVar42 = true;
    }
    if (_Var11 == false) goto LAB_0015b7c5;
    goto LAB_0015b6a7;
  }
  if (uVar10 == '\x1e') {
    local_90 = ALPN_h3;
    goto switchD_0015b5db_caseD_2;
  }
  if (uVar10 != '\x1f') goto switchD_0015b5db_caseD_4;
switchD_0015b5db_caseD_1:
  if ((CURLcode)local_98 != CURLE_OK) goto switchD_0015a04c_caseD_5;
LAB_0015b7c5:
  CVar32 = conn->bits;
  if (((ulong)CVar32 & 1) != 0) {
    CVar16 = Curl_idnconvert_hostname(&(conn->http_proxy).host);
    if (CVar16 == CURLE_OK) {
      CVar32 = conn->bits;
      goto LAB_0015b7ec;
    }
    goto LAB_0015a22d;
  }
LAB_0015b7ec:
  if (((ulong)CVar32 & 2) != 0) {
    CVar16 = Curl_idnconvert_hostname(&(conn->socks_proxy).host);
    if (CVar16 != CURLE_OK) goto LAB_0015a22d;
    CVar32 = conn->bits;
  }
  if ((CVar32._0_4_ >> 8 & 1) != 0) {
    CVar16 = Curl_idnconvert_hostname(local_48);
    if (CVar16 != CURLE_OK) goto LAB_0015a22d;
    CVar32 = conn->bits;
    if ((CVar32._0_4_ >> 8 & 1) != 0) {
      iVar15 = curl_strequal((conn->conn_to_host).name,(conn->host).name);
      CVar32 = conn->bits;
      if (iVar15 != 0) {
        CVar32 = (ConnectBits)((ulong)CVar32 & 0xfffffffffffffeff);
        conn->bits = CVar32;
      }
    }
  }
  if (((CVar32._0_4_ >> 9 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
    CVar32 = (ConnectBits)((ulong)CVar32 & 0xfffffffffffffdff);
    conn->bits = CVar32;
  }
  if (((ulong)CVar32 & 1) != 0 && ((ulong)CVar32 & 0x300) != 0) {
    conn->bits = (ConnectBits)((ulong)CVar32 | 8);
  }
  pCVar24 = conn->handler;
  if (pCVar24->setup_connection != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0) {
    CVar16 = (*pCVar24->setup_connection)(data,conn);
    if (CVar16 != CURLE_OK) goto LAB_0015a22d;
    pCVar24 = conn->handler;
  }
  uVar37 = (conn->primary).remote_port;
  if ((int)uVar37 < 0) {
    uVar37 = pCVar24->defport;
    (conn->primary).remote_port = uVar37;
  }
  uVar25 = (ulong)uVar37;
  uVar37 = SUB84(conn->bits,0);
  lVar36 = 0xf0;
  if ((uVar37 & 9) != 1) {
    uVar25 = (ulong)(uint)conn->remote_port;
    lVar36 = 0x98;
    if ((uVar37 >> 8 & 1) == 0) {
      lVar36 = 0x68;
    }
  }
  pcVar20 = curl_maprintf("%u/%d/%s",(ulong)conn->scope_id,uVar25,
                          *(undefined8 *)((long)&(conn->cpool_node)._list + lVar36));
  conn->destination = pcVar20;
  local_98._0_4_ = CVar17;
  if (pcVar20 == (char *)0x0) goto switchD_0015a04c_caseD_5;
  sVar22 = strlen(pcVar20);
  conn->destination_len = sVar22 + 1;
  Curl_strntolower(pcVar20,pcVar20,sVar22);
  pCVar24 = conn->handler;
  if ((pCVar24->flags & 0x10) == 0) {
    conn->recv[0] = Curl_cf_recv;
    conn->send[0] = Curl_cf_send;
    conn->recv[1] = Curl_cf_recv;
    conn->send[1] = Curl_cf_send;
    conn->bits = (ConnectBits)
                 ((ulong)conn->bits & 0xffffffffff7fffff |
                 (ulong)((uint)((ulong)*(undefined8 *)&(data->set).field_0x8ca >> 0x10) & 0x800000))
    ;
    CVar16 = Curl_ssl_easy_config_complete(data);
    if (CVar16 != CURLE_OK) goto LAB_0015a22d;
    Curl_cpool_prune_dead(data);
    if (((((data->set).field_0x8cd & 0x40) == 0) || ((data->state).followlocation != 0)) &&
       ((data->set).connect_only == '\0')) {
      newurl = (char *)0x0;
      uStack_70 = 0;
      pCStack_80 = data;
      local_78 = conn;
      if ((((conn->handler->protocol & 0xc0000003) == 0) || ((~*(uint *)&conn->bits & 0x2020) == 0))
         || ((_Var11 = Curl_multiplex_wanted(data->multi), !_Var11 ||
             (bVar12 = 1, (data->state).httpwant < 3)))) {
        bVar12 = 0;
      }
      if (((data->state).authhost.want & 8) == 0) {
        bVar31 = 0;
      }
      else {
        bVar31 = ((conn->handler->protocol & 0xc0000003) != 0) * '\x02';
      }
      if ((((ulong)conn->bits & 4) == 0) || (((data->state).authproxy.want & 8) == 0)) {
        bVar33 = 0;
      }
      else {
        bVar33 = ((conn->handler->protocol & 0xc0000003) != 0) << 2;
      }
      uStack_70 = CONCAT71(uStack_70._1_7_,bVar31 | bVar12 | bVar33);
      _Var11 = Curl_cpool_find(data,conn->destination,conn->destination_len,url_match_conn,
                               url_match_result,&newurl);
      conn_00 = (connectdata *)newurl;
      if (!_Var11) {
        uVar25 = uStack_70 >> 3 & 0x1f;
        goto LAB_0015b9ad;
      }
      pcVar20 = newurl;
      if (*ppcVar38 != (char *)0x0) {
        (*Curl_cfree)(*(void **)(newurl + 0x1e0));
        pcVar20[0x1e0] = '\0';
        pcVar20[0x1e1] = '\0';
        pcVar20[0x1e2] = '\0';
        pcVar20[0x1e3] = '\0';
        pcVar20[0x1e4] = '\0';
        pcVar20[0x1e5] = '\0';
        pcVar20[0x1e6] = '\0';
        pcVar20[0x1e7] = '\0';
        (*Curl_cfree)(*(void **)((long)conn_00 + 0x1e8));
        pcVar20[0x1e8] = '\0';
        pcVar20[0x1e9] = '\0';
        pcVar20[0x1ea] = '\0';
        pcVar20[0x1eb] = '\0';
        pcVar20[0x1ec] = '\0';
        pcVar20[0x1ed] = '\0';
        pcVar20[0x1ee] = '\0';
        pcVar20[0x1ef] = '\0';
        pcVar41 = conn->passwd;
        *(char **)((long)conn_00 + 0x1e0) = *ppcVar38;
        *(char **)((long)conn_00 + 0x1e8) = pcVar41;
        *ppcVar38 = (char *)0x0;
        conn->passwd = (char *)0x0;
      }
      uVar25 = (ulong)(SUB84(conn->bits,0) & 4);
      *(ulong *)((long)conn_00 + 0x3b8) =
           *(ulong *)((long)conn_00 + 0x3b8) & 0xfffffffffffffffb | uVar25;
      if (uVar25 != 0) {
        (*Curl_cfree)(*(void **)((long)conn_00 + 0x108));
        pcVar20[0x108] = '\0';
        pcVar20[0x109] = '\0';
        pcVar20[0x10a] = '\0';
        pcVar20[0x10b] = '\0';
        pcVar20[0x10c] = '\0';
        pcVar20[0x10d] = '\0';
        pcVar20[0x10e] = '\0';
        pcVar20[0x10f] = '\0';
        (*Curl_cfree)(*(void **)((long)conn_00 + 0xd0));
        pcVar20[0xd0] = '\0';
        pcVar20[0xd1] = '\0';
        pcVar20[0xd2] = '\0';
        pcVar20[0xd3] = '\0';
        pcVar20[0xd4] = '\0';
        pcVar20[0xd5] = '\0';
        pcVar20[0xd6] = '\0';
        pcVar20[0xd7] = '\0';
        (*Curl_cfree)(*(void **)((long)conn_00 + 0x110));
        pcVar20[0x110] = '\0';
        pcVar20[0x111] = '\0';
        pcVar20[0x112] = '\0';
        pcVar20[0x113] = '\0';
        pcVar20[0x114] = '\0';
        pcVar20[0x115] = '\0';
        pcVar20[0x116] = '\0';
        pcVar20[0x117] = '\0';
        (*Curl_cfree)(*(void **)((long)conn_00 + 0xd8));
        pcVar20[0xd8] = '\0';
        pcVar20[0xd9] = '\0';
        pcVar20[0xda] = '\0';
        pcVar20[0xdb] = '\0';
        pcVar20[0xdc] = '\0';
        pcVar20[0xdd] = '\0';
        pcVar20[0xde] = '\0';
        pcVar20[0xdf] = '\0';
        pcVar41 = (conn->http_proxy).passwd;
        *(char **)((long)conn_00 + 0x108) = (conn->http_proxy).user;
        *(char **)((long)conn_00 + 0x110) = pcVar41;
        pcVar41 = (conn->socks_proxy).passwd;
        *(char **)((long)conn_00 + 0xd0) = (conn->socks_proxy).user;
        *(char **)((long)conn_00 + 0xd8) = pcVar41;
        (conn->socks_proxy).user = (char *)0x0;
        (conn->socks_proxy).passwd = (char *)0x0;
        (conn->http_proxy).user = (char *)0x0;
        (conn->http_proxy).passwd = (char *)0x0;
      }
      (*Curl_cfree)(*(void **)((long)conn_00 + 0x58));
      pcVar20[0x58] = '\0';
      pcVar20[0x59] = '\0';
      pcVar20[0x5a] = '\0';
      pcVar20[0x5b] = '\0';
      pcVar20[0x5c] = '\0';
      pcVar20[0x5d] = '\0';
      pcVar20[0x5e] = '\0';
      pcVar20[0x5f] = '\0';
      (*Curl_cfree)(*(void **)((long)conn_00 + 0x88));
      pcVar20[0x88] = '\0';
      pcVar20[0x89] = '\0';
      pcVar20[0x8a] = '\0';
      pcVar20[0x8b] = '\0';
      pcVar20[0x8c] = '\0';
      pcVar20[0x8d] = '\0';
      pcVar20[0x8e] = '\0';
      pcVar20[0x8f] = '\0';
      pcVar41 = local_58->encalloc;
      pcVar35 = local_58->name;
      pcVar26 = local_58->dispname;
      *(char **)((long)conn_00 + 0x58) = local_58->rawalloc;
      *(char **)((long)conn_00 + 0x60) = pcVar41;
      *(char **)((long)conn_00 + 0x68) = pcVar35;
      *(char **)((long)conn_00 + 0x70) = pcVar26;
      local_58->rawalloc = (char *)0x0;
      local_58->encalloc = (char *)0x0;
      pcVar41 = local_48->rawalloc;
      pcVar35 = local_48->encalloc;
      pcVar26 = local_48->dispname;
      *(char **)((long)conn_00 + 0x98) = local_48->name;
      *(char **)((long)conn_00 + 0xa0) = pcVar26;
      *(char **)((long)conn_00 + 0x88) = pcVar41;
      *(char **)((long)conn_00 + 0x90) = pcVar35;
      (conn->conn_to_host).rawalloc = (char *)0x0;
      *(undefined8 *)((long)conn_00 + 0x570) = *(undefined8 *)&conn->remote_port;
      (*Curl_cfree)(*(void **)((long)conn_00 + 0x78));
      pcVar20[0x78] = '\0';
      pcVar20[0x79] = '\0';
      pcVar20[0x7a] = '\0';
      pcVar20[0x7b] = '\0';
      pcVar20[0x7c] = '\0';
      pcVar20[0x7d] = '\0';
      pcVar20[0x7e] = '\0';
      pcVar20[0x7f] = '\0';
      *(char **)((long)conn_00 + 0x78) = conn->hostname_resolve;
      conn->hostname_resolve = (char *)0x0;
      *(byte *)((long)conn_00 + 0x3b8) = *(byte *)((long)conn_00 + 0x3b8) | 0x40;
      Curl_conn_free(data,conn);
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 || (0 < pcVar30->log_level)
          ))) {
        pcVar20 = "proxy";
        if ((*(byte *)((long)conn_00 + 0x3b8) & 0x10) == 0) {
          pcVar20 = "host";
        }
        lVar36 = 0xc0;
        if (*(long *)((long)conn_00 + 0xb8) == 0) {
          lVar36 = 0xf8;
          if (*(long *)((long)conn_00 + 0xf0) == 0) {
            lVar36 = 0x70;
          }
        }
        Curl_infof(data,"Re-using existing connection with %s %s",pcVar20,
                   *(undefined8 *)((long)conn_00 + lVar36));
      }
LAB_0015bf99:
      Curl_init_do(data,conn_00);
      local_98._0_4_ = setup_range(data);
      conn = conn_00;
      if ((CURLcode)local_98 != CURLE_OK) goto switchD_0015a04c_caseD_5;
      if (((ulong)conn_00->bits & 0x40) == 0) {
        tVar27 = Curl_timeleft(data,(curltime *)0x0,true);
        pcVar20 = conn_00->unix_domain_socket;
        if (pcVar20 == (char *)0x0) {
          CVar32 = conn_00->bits;
          if (((ulong)CVar32 & 0x10) == 0) {
            lVar36 = 0x88;
            if ((CVar32._0_4_ >> 8 & 1) == 0) {
              lVar36 = 0x58;
            }
            (conn_00->primary).remote_port =
                 *(int *)((long)&conn_00->remote_port + (ulong)(CVar32._0_4_ >> 7 & 4));
            pcVar20 = "host";
          }
          else {
            pcVar20 = (conn_00->socks_proxy).host.name;
            if ((pcVar20 != (char *)0x0) && (iVar15 = strncmp("localhost/",pcVar20,10), iVar15 == 0)
               ) {
              pcVar20 = pcVar20 + 9;
              goto LAB_0015bff2;
            }
            lVar36 = 0xa8;
            if (((ulong)CVar32 & 2) == 0) {
              lVar36 = 0xe0;
            }
            pcVar20 = "proxy";
          }
          pcVar41 = (*Curl_cstrdup)(*(char **)((long)&(conn_00->cpool_node)._prev + lVar36));
          conn_00->hostname_resolve = pcVar41;
          local_98._0_4_ = CVar17;
          if (pcVar41 == (char *)0x0) goto switchD_0015a04c_caseD_5;
          rVar18 = Curl_resolv_timeout(data,pcVar41,(conn_00->primary).remote_port,
                                       &conn_00->dns_entry,tVar27);
          if (rVar18 == CURLRESOLV_TIMEDOUT) {
            uVar5 = *(undefined8 *)((long)&(conn_00->cpool_node)._next + lVar36);
            cVar43 = Curl_now();
            uVar6 = (data->progress).t_startsingle.tv_sec;
            uVar7 = (data->progress).t_startsingle.tv_usec;
            older.tv_usec = uVar7;
            older.tv_sec = uVar6;
            newer._12_4_ = 0;
            newer.tv_sec = SUB128(cVar43._0_12_,0);
            newer.tv_usec = SUB124(cVar43._0_12_,8);
            older._12_4_ = 0;
            tVar27 = Curl_timediff(newer,older);
            Curl_failf(data,"Failed to resolve %s \'%s\' with timeout after %ld ms",pcVar20,uVar5,
                       tVar27);
            local_98._0_4_ = CURLE_OPERATION_TIMEDOUT;
            goto switchD_0015a04c_caseD_5;
          }
          if (rVar18 == CURLRESOLV_PENDING) {
            *local_50 = true;
          }
          else if (conn_00->dns_entry == (Curl_dns_entry *)0x0) {
            Curl_failf(data,"Could not resolve %s: %s",pcVar20,
                       *(undefined8 *)((long)&(conn_00->cpool_node)._next + lVar36));
            local_98._0_4_ = CURLE_COULDNT_RESOLVE_HOST;
            goto switchD_0015a04c_caseD_5;
          }
        }
        else {
LAB_0015bff2:
          conn_00->transport = '\x06';
          newurl = (char *)((ulong)newurl & 0xffffffffffffff00);
          pCVar28 = (Curl_dns_entry *)(*Curl_ccalloc)(1,0x20);
          if (pCVar28 == (Curl_dns_entry *)0x0) {
switchD_0015a04c_caseD_7:
            local_98._0_4_ = CURLE_OUT_OF_MEMORY;
            goto switchD_0015a04c_caseD_5;
          }
          pCVar29 = Curl_unix2addr(pcVar20,(_Bool *)&newurl,
                                   (_Bool)((byte)((uint)*(undefined4 *)&conn_00->bits >> 0x1a) & 1))
          ;
          pCVar28->addr = pCVar29;
          if (pCVar29 == (Curl_addrinfo *)0x0) {
            if ((char)newurl == '\x01') {
              Curl_failf(data,"Unix socket path too long: \'%s\'",pcVar20);
            }
            (*Curl_cfree)(pCVar28);
            local_98._0_4_ = CURLE_OUT_OF_MEMORY;
            if ((char)newurl != '\0') {
              local_98._0_4_ = CURLE_COULDNT_RESOLVE_HOST;
            }
            goto switchD_0015a04c_caseD_5;
          }
          pCVar28->refcount = 1;
          conn_00->dns_entry = pCVar28;
        }
      }
      else {
        *local_50 = false;
      }
      pCVar24 = conn_00->handler;
      (data->info).conn_scheme = pCVar24->scheme;
      (data->info).conn_protocol = pCVar24->protocol & 0x3ffffff;
      (data->info).field_0xe4 = (data->info).field_0xe4 & 0xfd | *(byte *)&conn_00->bits >> 3 & 2;
      CVar16 = Curl_conn_ev_data_setup(data);
      goto LAB_0015bae5;
    }
    uVar25 = 0;
LAB_0015b9ad:
    if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x8cf & 1) != 0)) {
      puVar1 = &(conn->bits).field_0x3;
      *puVar1 = *puVar1 | 1;
    }
    if ((uVar25 & 1) != 0) goto LAB_0015b9d6;
    iVar15 = Curl_cpool_check_limits(data,conn);
    if (iVar15 == 2) {
      uVar37 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
      if (-1 < (data->set).dohfor_mid) {
        if (((uVar37 >> 0x1c & 1) != 0) &&
           ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 ||
            (0 < pcVar30->log_level)))) {
          Curl_infof(data,"Allowing DoH to override max connection limit");
        }
        goto LAB_0015bc47;
      }
      if ((uVar37 >> 0x1c & 1) == 0) goto LAB_0015b9d6;
      pcVar30 = (data->state).feat;
      pcVar20 = "No connections available in cache";
    }
    else {
      if (iVar15 != 1) {
LAB_0015bc47:
        CVar16 = Curl_ssl_conn_config_init(data,conn);
        if (CVar16 == CURLE_OK) {
          Curl_attach_connection(data,conn);
          CVar16 = Curl_cpool_add_conn(data,conn);
          if (CVar16 == CURLE_OK) {
            if ((((data->state).authhost.picked & 8) != 0) &&
               (bVar12 = (data->state).authhost.field_0x18, (bVar12 & 1) != 0)) {
              if ((((data->set).field_0x8cd & 0x10) != 0) &&
                 ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar30->log_level)))) {
                Curl_infof(data,"NTLM picked AND auth done set, clear picked");
                bVar12 = (data->state).authhost.field_0x18;
              }
              (data->state).authhost.picked = 0;
              (data->state).authhost.field_0x18 = bVar12 & 0xfe;
            }
            conn_00 = conn;
            if ((((data->state).authproxy.picked & 8) != 0) &&
               (bVar12 = (data->state).authproxy.field_0x18, (bVar12 & 1) != 0)) {
              if ((((data->set).field_0x8cd & 0x10) != 0) &&
                 ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar30->log_level)))) {
                Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
                bVar12 = (data->state).authproxy.field_0x18;
              }
              (data->state).authproxy.picked = 0;
              (data->state).authproxy.field_0x18 = bVar12 & 0xfe;
            }
            goto LAB_0015bf99;
          }
        }
        goto LAB_0015a22d;
      }
      if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_0015b9d6;
      pcVar30 = (data->state).feat;
      pcVar20 = "No more connections allowed to host";
    }
    if ((pcVar30 == (curl_trc_feat *)0x0) || (0 < pcVar30->log_level)) {
      Curl_infof(data,pcVar20);
    }
LAB_0015b9d6:
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 || (0 < pcVar30->log_level)))
       ) {
      Curl_infof(data,"No connections available.");
    }
    Curl_conn_free(data,conn);
    return CURLE_NO_CONNECTION_AVAILABLE;
  }
  (data->info).conn_scheme = pCVar24->scheme;
  (data->info).conn_protocol = pCVar24->protocol & 0x3ffffff;
  CVar17 = (*pCVar24->connect_it)(data,(_Bool *)&newurl);
  if (CVar17 == CURLE_OK) {
    Curl_attach_connection(data,conn);
    CVar16 = Curl_cpool_add_conn(data,conn);
    if (CVar16 == CURLE_OK) {
      CVar16 = setup_range(data);
      if (CVar16 == CURLE_OK) {
        Curl_xfer_setup_nop(data);
        goto LAB_0015ba93;
      }
      (*conn->handler->done)(data,CVar16,false);
    }
  }
  else {
LAB_0015ba93:
    Curl_init_do(data,conn);
    CVar16 = CVar17;
  }
LAB_0015bae5:
  if (CVar16 == CURLE_OK) {
    sVar21 = Curl_llist_count(&conn->easyq);
    if (1 < sVar21) {
      *local_40 = true;
      return CURLE_OK;
    }
    if (*local_50 != false) {
      return CURLE_OK;
    }
    CVar16 = Curl_setup_conn(data,local_40);
  }
LAB_0015a22d:
  local_98._0_4_ = CVar16;
  if (CVar16 == CURLE_NO_CONNECTION_AVAILABLE) {
    return CURLE_NO_CONNECTION_AVAILABLE;
  }
  goto switchD_0015a04c_caseD_5;
LAB_0015b280:
  bVar12 = *pbVar39;
  __s = pbVar39;
  if (bVar12 == 0) goto LAB_0015b2ca;
  if ((((9 < (byte)(bVar12 - 0x30)) && (0x19 < (byte)((bVar12 & 0xdf) + 0xbf))) &&
      (1 < bVar12 - 0x2d)) && ((bVar12 != 0x7e && (bVar12 != 0x5f)))) goto LAB_0015b2bd;
  pbVar39 = pbVar39 + 1;
  goto LAB_0015b280;
LAB_0015b2bd:
  if (bVar12 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_0015b2ca:
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 || (0 < pcVar30->log_level)))
       ) {
      Curl_infof(data,"Invalid IPv6 address format");
    }
  }
LAB_0015b2f6:
  pcVar20 = strchr((char *)__s,0x3a);
  uVar25 = 0xffffffff;
  if (pcVar20 == (char *)0x0) {
LAB_0015b354:
    pcVar20 = (*Curl_cstrdup)((char *)local_98);
    local_98._0_4_ = CURLE_OK;
    if (pcVar20 == (char *)0x0) {
      local_98._0_4_ = CURLE_OUT_OF_MEMORY;
      goto LAB_0015b3ad;
    }
    bVar42 = true;
  }
  else {
    newurl = (char *)0x0;
    *pcVar20 = '\0';
    uVar25 = 0xffffffff;
    if (pcVar20[1] == '\0') goto LAB_0015b354;
    local_38 = pcVar20 + 1;
    uVar25 = strtol(local_38,&newurl,10);
    if (((newurl == (char *)0x0) || (*newurl == '\0')) && (uVar25 < 0x10000)) goto LAB_0015b354;
    Curl_failf(data,"No valid port number in connect to host string (%s)",local_38);
    local_98._0_4_ = CURLE_SETOPT_OPTION_SYNTAX;
LAB_0015b3ad:
    pcVar20 = (char *)0x0;
    uVar25 = 0xffffffff;
    bVar42 = false;
  }
  (*Curl_cfree)(local_60);
  if (!bVar42) goto switchD_0015b5db_caseD_1;
  if (pcVar20 == (char *)0x0) {
    pcVar20 = (char *)0x0;
  }
  else if (*pcVar20 != '\0') {
    (conn->conn_to_host).rawalloc = pcVar20;
    (conn->conn_to_host).name = pcVar20;
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 | 1;
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 || (0 < pcVar30->log_level)))
       ) {
      Curl_infof(data,"Connecting to hostname: %s",pcVar20);
    }
    goto LAB_0015b1d8;
  }
LAB_0015b1c1:
  puVar1 = &(conn->bits).field_0x1;
  *puVar1 = *puVar1 & 0xfe;
  (*Curl_cfree)(pcVar20);
  pcVar20 = (char *)0x0;
LAB_0015b1d8:
  if ((int)uVar25 < 0) {
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 & 0xfd;
  }
  else {
    conn->conn_to_port = (int)uVar25;
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 | 2;
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar30 = (data->state).feat, pcVar30 == (curl_trc_feat *)0x0 || (0 < pcVar30->log_level)))
       ) {
      Curl_infof(data,"Connecting to port: %d",uVar25 & 0xffffffff);
    }
  }
  local_a8 = &pcVar4->next;
  goto LAB_0015b019;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* Set the request to virgin state based on transfer settings */
  Curl_req_hard_reset(&data->req, data);

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that is either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We are not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_cpool_disconnect(data, conn, TRUE);
  }

  return result;
}